

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_arith_add(DisasContext_conflict10 *ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2,
                     TCGv_i64 ca,TCGv_i64 ca32,_Bool add_ca,_Bool compute_ca,_Bool compute_ov,
                     _Bool compute_rc0)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *s_00;
  TCGTemp *pTVar2;
  TCGv_i64 ah;
  TCGv_i64 pTVar3;
  uintptr_t o_2;
  uintptr_t o_4;
  TCGv_i64 ah_00;
  uintptr_t o_8;
  uintptr_t o;
  TCGv_i64 rl;
  
  s = ctx->uc->tcg_ctx;
  rl = ret;
  if (compute_ca || compute_ov) {
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    rl = (TCGv_i64)((long)pTVar2 - (long)s);
  }
  if (compute_ca) {
    if (ctx->sf_mode == false) {
      pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)pTVar2,(TCGArg)(arg1 + (long)&s->pool_cur),
                        (TCGArg)(arg2 + (long)&s->pool_cur));
      pTVar3 = rl + (long)&s->pool_cur;
      tcg_gen_op3_ppc64(s,INDEX_op_add_i64,(TCGArg)pTVar3,(TCGArg)(arg1 + (long)&s->pool_cur),
                        (TCGArg)(arg2 + (long)&s->pool_cur));
      if (add_ca) {
        tcg_gen_op3_ppc64(s,INDEX_op_add_i64,(TCGArg)pTVar3,(TCGArg)pTVar3,
                          (TCGArg)(ca + (long)&s->pool_cur));
      }
      tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)(ca + (long)&s->pool_cur),(TCGArg)pTVar3,
                        (TCGArg)pTVar2);
      tcg_temp_free_internal_ppc64(s,pTVar2);
      tcg_gen_extract_i64_ppc64(s,ca,ca,0x20,1);
      if ((ca32 != ca) && ((ctx->insns_flags2 & 0x80000) != 0)) {
        tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)(ca32 + (long)s),
                          (TCGArg)(ca + (long)&s->pool_cur));
      }
    }
    else {
      ah = tcg_const_i64_ppc64(s,0);
      pTVar3 = arg1;
      ah_00 = ah;
      if (add_ca) {
        tcg_gen_add2_i64_ppc64(s,rl,ca,arg1,ah,ca,ah);
        pTVar3 = rl;
        ah_00 = ca;
      }
      tcg_gen_add2_i64_ppc64(s,rl,ca,pTVar3,ah_00,arg2,ah);
      if ((ctx->insns_flags2 & 0x80000) != 0) {
        s_00 = ctx->uc->tcg_ctx;
        pTVar2 = tcg_temp_new_internal_ppc64(s_00,TCG_TYPE_I64,false);
        tcg_gen_op3_ppc64(s_00,INDEX_op_xor_i64,(TCGArg)pTVar2,
                          (TCGArg)(arg1 + (long)&s_00->pool_cur),
                          (TCGArg)(arg2 + (long)&s_00->pool_cur));
        tcg_gen_op3_ppc64(s_00,INDEX_op_xor_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,
                          (TCGArg)(rl + (long)&s_00->pool_cur));
        tcg_gen_extract_i64_ppc64(s_00,ca32,(TCGv_i64)((long)pTVar2 - (long)s_00),0x20,1);
        tcg_temp_free_internal_ppc64(s_00,pTVar2);
      }
      tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ah + (long)s));
    }
  }
  else {
    pTVar3 = rl + (long)&s->pool_cur;
    tcg_gen_op3_ppc64(s,INDEX_op_add_i64,(TCGArg)pTVar3,(TCGArg)(arg1 + (long)&s->pool_cur),
                      (TCGArg)(arg2 + (long)&s->pool_cur));
    if (add_ca) {
      tcg_gen_op3_ppc64(s,INDEX_op_add_i64,(TCGArg)pTVar3,(TCGArg)pTVar3,(TCGArg)(ca + (long)s));
    }
  }
  if (compute_ov) {
    gen_op_arith_compute_ov(ctx,rl,arg1,arg2,0);
  }
  if (compute_rc0) {
    uVar1._0_1_ = ctx->sf_mode;
    uVar1._1_1_ = ctx->has_cfar;
    uVar1._2_1_ = ctx->fpu_enabled;
    uVar1._3_1_ = ctx->altivec_enabled;
    gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  }
  if (rl == ret) {
    return;
  }
  tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)(ret + (long)s),(TCGArg)(rl + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(rl + (long)s));
  return;
}

Assistant:

static inline void gen_op_arith_add(DisasContext *ctx, TCGv ret, TCGv arg1,
                                    TCGv arg2, TCGv ca, TCGv ca32,
                                    bool add_ca, bool compute_ca,
                                    bool compute_ov, bool compute_rc0)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = ret;

    if (compute_ca || compute_ov) {
        t0 = tcg_temp_new(tcg_ctx);
    }

    if (compute_ca) {
        if (NARROW_MODE(ctx)) {
            /*
             * Caution: a non-obvious corner case of the spec is that
             * we must produce the *entire* 64-bit addition, but
             * produce the carry into bit 32.
             */
            TCGv t1 = tcg_temp_new(tcg_ctx);
            tcg_gen_xor_tl(tcg_ctx, t1, arg1, arg2);        /* add without carry */
            tcg_gen_add_tl(tcg_ctx, t0, arg1, arg2);
            if (add_ca) {
                tcg_gen_add_tl(tcg_ctx, t0, t0, ca);
            }
            tcg_gen_xor_tl(tcg_ctx, ca, t0, t1);        /* bits changed w/ carry */
            tcg_temp_free(tcg_ctx, t1);
            tcg_gen_extract_tl(tcg_ctx, ca, ca, 32, 1);
            if (is_isa300(ctx)) {
                tcg_gen_mov_tl(tcg_ctx, ca32, ca);
            }
        } else {
            TCGv zero = tcg_const_tl(tcg_ctx, 0);
            if (add_ca) {
                tcg_gen_add2_tl(tcg_ctx, t0, ca, arg1, zero, ca, zero);
                tcg_gen_add2_tl(tcg_ctx, t0, ca, t0, ca, arg2, zero);
            } else {
                tcg_gen_add2_tl(tcg_ctx, t0, ca, arg1, zero, arg2, zero);
            }
            gen_op_arith_compute_ca32(ctx, t0, arg1, arg2, ca32, 0);
            tcg_temp_free(tcg_ctx, zero);
        }
    } else {
        tcg_gen_add_tl(tcg_ctx, t0, arg1, arg2);
        if (add_ca) {
            tcg_gen_add_tl(tcg_ctx, t0, t0, ca);
        }
    }

    if (compute_ov) {
        gen_op_arith_compute_ov(ctx, t0, arg1, arg2, 0);
    }
    if (unlikely(compute_rc0)) {
        gen_set_Rc0(ctx, t0);
    }

    if (t0 != ret) {
        tcg_gen_mov_tl(tcg_ctx, ret, t0);
        tcg_temp_free(tcg_ctx, t0);
    }
}